

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multi_Label.cxx
# Opt level: O3

void multi_measure(Fl_Label *o,int *w,int *h)

{
  char *pcVar1;
  int H;
  int W;
  Fl_Label local;
  int local_60;
  int local_5c;
  Fl_Label local_58;
  
  pcVar1 = o->value;
  local_58.image = o->image;
  local_58.deimage = o->deimage;
  local_58.font = o->font;
  local_58.size = o->size;
  local_58.color = o->color;
  local_58.align_ = o->align_;
  local_58.value = *(char **)pcVar1;
  local_58.type = pcVar1[0x10];
  local_58._41_7_ = SUB87((ulong)*(undefined8 *)&o->type >> 8,0);
  Fl_Label::measure(&local_58,w,h);
  local_58.value = *(char **)(pcVar1 + 8);
  local_58.type = pcVar1[0x11];
  local_5c = 0;
  local_60 = 0;
  Fl_Label::measure(&local_58,&local_5c,&local_60);
  *w = *w + local_5c;
  if (*h < local_60) {
    *h = local_60;
  }
  return;
}

Assistant:

static void multi_measure(const Fl_Label* o, int& w, int& h) {
  Fl_Multi_Label* b = (Fl_Multi_Label*)(o->value);
  Fl_Label local = *o;
  local.value = b->labela;
  local.type = b->typea;
  local.measure(w,h);
  local.value = b->labelb;
  local.type = b->typeb;
  int W = 0; int H = 0; local.measure(W,H);
  w += W; if (H>h) h = H;
}